

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O2

void ggml_thread_cpumask_next(_Bool *global_mask,_Bool *param_2,_Bool strict,int32_t *iter)

{
  int32_t iVar1;
  undefined7 in_register_00000011;
  int iVar2;
  int iVar3;
  bool bVar4;
  
  if ((int)CONCAT71(in_register_00000011,strict) == 0) {
    memcpy(param_2,global_mask,0x200);
    return;
  }
  iVar2 = 0x200;
  param_2[0x1c0] = false;
  param_2[0x1c1] = false;
  param_2[0x1c2] = false;
  param_2[0x1c3] = false;
  param_2[0x1c4] = false;
  param_2[0x1c5] = false;
  param_2[0x1c6] = false;
  param_2[0x1c7] = false;
  param_2[0x1c8] = false;
  param_2[0x1c9] = false;
  param_2[0x1ca] = false;
  param_2[0x1cb] = false;
  param_2[0x1cc] = false;
  param_2[0x1cd] = false;
  param_2[0x1ce] = false;
  param_2[0x1cf] = false;
  param_2[0x1d0] = false;
  param_2[0x1d1] = false;
  param_2[0x1d2] = false;
  param_2[0x1d3] = false;
  param_2[0x1d4] = false;
  param_2[0x1d5] = false;
  param_2[0x1d6] = false;
  param_2[0x1d7] = false;
  param_2[0x1d8] = false;
  param_2[0x1d9] = false;
  param_2[0x1da] = false;
  param_2[0x1db] = false;
  param_2[0x1dc] = false;
  param_2[0x1dd] = false;
  param_2[0x1de] = false;
  param_2[0x1df] = false;
  param_2[0x1e0] = false;
  param_2[0x1e1] = false;
  param_2[0x1e2] = false;
  param_2[0x1e3] = false;
  param_2[0x1e4] = false;
  param_2[0x1e5] = false;
  param_2[0x1e6] = false;
  param_2[0x1e7] = false;
  param_2[0x1e8] = false;
  param_2[0x1e9] = false;
  param_2[0x1ea] = false;
  param_2[0x1eb] = false;
  param_2[0x1ec] = false;
  param_2[0x1ed] = false;
  param_2[0x1ee] = false;
  param_2[0x1ef] = false;
  param_2[0x1f0] = false;
  param_2[0x1f1] = false;
  param_2[0x1f2] = false;
  param_2[499] = false;
  param_2[500] = false;
  param_2[0x1f5] = false;
  param_2[0x1f6] = false;
  param_2[0x1f7] = false;
  param_2[0x1f8] = false;
  param_2[0x1f9] = false;
  param_2[0x1fa] = false;
  param_2[0x1fb] = false;
  param_2[0x1fc] = false;
  param_2[0x1fd] = false;
  param_2[0x1fe] = false;
  param_2[0x1ff] = false;
  param_2[0x180] = false;
  param_2[0x181] = false;
  param_2[0x182] = false;
  param_2[0x183] = false;
  param_2[0x184] = false;
  param_2[0x185] = false;
  param_2[0x186] = false;
  param_2[0x187] = false;
  param_2[0x188] = false;
  param_2[0x189] = false;
  param_2[0x18a] = false;
  param_2[0x18b] = false;
  param_2[0x18c] = false;
  param_2[0x18d] = false;
  param_2[0x18e] = false;
  param_2[399] = false;
  param_2[400] = false;
  param_2[0x191] = false;
  param_2[0x192] = false;
  param_2[0x193] = false;
  param_2[0x194] = false;
  param_2[0x195] = false;
  param_2[0x196] = false;
  param_2[0x197] = false;
  param_2[0x198] = false;
  param_2[0x199] = false;
  param_2[0x19a] = false;
  param_2[0x19b] = false;
  param_2[0x19c] = false;
  param_2[0x19d] = false;
  param_2[0x19e] = false;
  param_2[0x19f] = false;
  param_2[0x1a0] = false;
  param_2[0x1a1] = false;
  param_2[0x1a2] = false;
  param_2[0x1a3] = false;
  param_2[0x1a4] = false;
  param_2[0x1a5] = false;
  param_2[0x1a6] = false;
  param_2[0x1a7] = false;
  param_2[0x1a8] = false;
  param_2[0x1a9] = false;
  param_2[0x1aa] = false;
  param_2[0x1ab] = false;
  param_2[0x1ac] = false;
  param_2[0x1ad] = false;
  param_2[0x1ae] = false;
  param_2[0x1af] = false;
  param_2[0x1b0] = false;
  param_2[0x1b1] = false;
  param_2[0x1b2] = false;
  param_2[0x1b3] = false;
  param_2[0x1b4] = false;
  param_2[0x1b5] = false;
  param_2[0x1b6] = false;
  param_2[0x1b7] = false;
  param_2[0x1b8] = false;
  param_2[0x1b9] = false;
  param_2[0x1ba] = false;
  param_2[0x1bb] = false;
  param_2[0x1bc] = false;
  param_2[0x1bd] = false;
  param_2[0x1be] = false;
  param_2[0x1bf] = false;
  param_2[0x140] = false;
  param_2[0x141] = false;
  param_2[0x142] = false;
  param_2[0x143] = false;
  param_2[0x144] = false;
  param_2[0x145] = false;
  param_2[0x146] = false;
  param_2[0x147] = false;
  param_2[0x148] = false;
  param_2[0x149] = false;
  param_2[0x14a] = false;
  param_2[0x14b] = false;
  param_2[0x14c] = false;
  param_2[0x14d] = false;
  param_2[0x14e] = false;
  param_2[0x14f] = false;
  param_2[0x150] = false;
  param_2[0x151] = false;
  param_2[0x152] = false;
  param_2[0x153] = false;
  param_2[0x154] = false;
  param_2[0x155] = false;
  param_2[0x156] = false;
  param_2[0x157] = false;
  param_2[0x158] = false;
  param_2[0x159] = false;
  param_2[0x15a] = false;
  param_2[0x15b] = false;
  param_2[0x15c] = false;
  param_2[0x15d] = false;
  param_2[0x15e] = false;
  param_2[0x15f] = false;
  param_2[0x160] = false;
  param_2[0x161] = false;
  param_2[0x162] = false;
  param_2[0x163] = false;
  param_2[0x164] = false;
  param_2[0x165] = false;
  param_2[0x166] = false;
  param_2[0x167] = false;
  param_2[0x168] = false;
  param_2[0x169] = false;
  param_2[0x16a] = false;
  param_2[0x16b] = false;
  param_2[0x16c] = false;
  param_2[0x16d] = false;
  param_2[0x16e] = false;
  param_2[0x16f] = false;
  param_2[0x170] = false;
  param_2[0x171] = false;
  param_2[0x172] = false;
  param_2[0x173] = false;
  param_2[0x174] = false;
  param_2[0x175] = false;
  param_2[0x176] = false;
  param_2[0x177] = false;
  param_2[0x178] = false;
  param_2[0x179] = false;
  param_2[0x17a] = false;
  param_2[0x17b] = false;
  param_2[0x17c] = false;
  param_2[0x17d] = false;
  param_2[0x17e] = false;
  param_2[0x17f] = false;
  param_2[0x100] = false;
  param_2[0x101] = false;
  param_2[0x102] = false;
  param_2[0x103] = false;
  param_2[0x104] = false;
  param_2[0x105] = false;
  param_2[0x106] = false;
  param_2[0x107] = false;
  param_2[0x108] = false;
  param_2[0x109] = false;
  param_2[0x10a] = false;
  param_2[0x10b] = false;
  param_2[0x10c] = false;
  param_2[0x10d] = false;
  param_2[0x10e] = false;
  param_2[0x10f] = false;
  param_2[0x110] = false;
  param_2[0x111] = false;
  param_2[0x112] = false;
  param_2[0x113] = false;
  param_2[0x114] = false;
  param_2[0x115] = false;
  param_2[0x116] = false;
  param_2[0x117] = false;
  param_2[0x118] = false;
  param_2[0x119] = false;
  param_2[0x11a] = false;
  param_2[0x11b] = false;
  param_2[0x11c] = false;
  param_2[0x11d] = false;
  param_2[0x11e] = false;
  param_2[0x11f] = false;
  param_2[0x120] = false;
  param_2[0x121] = false;
  param_2[0x122] = false;
  param_2[0x123] = false;
  param_2[0x124] = false;
  param_2[0x125] = false;
  param_2[0x126] = false;
  param_2[0x127] = false;
  param_2[0x128] = false;
  param_2[0x129] = false;
  param_2[0x12a] = false;
  param_2[299] = false;
  param_2[300] = false;
  param_2[0x12d] = false;
  param_2[0x12e] = false;
  param_2[0x12f] = false;
  param_2[0x130] = false;
  param_2[0x131] = false;
  param_2[0x132] = false;
  param_2[0x133] = false;
  param_2[0x134] = false;
  param_2[0x135] = false;
  param_2[0x136] = false;
  param_2[0x137] = false;
  param_2[0x138] = false;
  param_2[0x139] = false;
  param_2[0x13a] = false;
  param_2[0x13b] = false;
  param_2[0x13c] = false;
  param_2[0x13d] = false;
  param_2[0x13e] = false;
  param_2[0x13f] = false;
  param_2[0xc0] = false;
  param_2[0xc1] = false;
  param_2[0xc2] = false;
  param_2[0xc3] = false;
  param_2[0xc4] = false;
  param_2[0xc5] = false;
  param_2[0xc6] = false;
  param_2[199] = false;
  param_2[200] = false;
  param_2[0xc9] = false;
  param_2[0xca] = false;
  param_2[0xcb] = false;
  param_2[0xcc] = false;
  param_2[0xcd] = false;
  param_2[0xce] = false;
  param_2[0xcf] = false;
  param_2[0xd0] = false;
  param_2[0xd1] = false;
  param_2[0xd2] = false;
  param_2[0xd3] = false;
  param_2[0xd4] = false;
  param_2[0xd5] = false;
  param_2[0xd6] = false;
  param_2[0xd7] = false;
  param_2[0xd8] = false;
  param_2[0xd9] = false;
  param_2[0xda] = false;
  param_2[0xdb] = false;
  param_2[0xdc] = false;
  param_2[0xdd] = false;
  param_2[0xde] = false;
  param_2[0xdf] = false;
  param_2[0xe0] = false;
  param_2[0xe1] = false;
  param_2[0xe2] = false;
  param_2[0xe3] = false;
  param_2[0xe4] = false;
  param_2[0xe5] = false;
  param_2[0xe6] = false;
  param_2[0xe7] = false;
  param_2[0xe8] = false;
  param_2[0xe9] = false;
  param_2[0xea] = false;
  param_2[0xeb] = false;
  param_2[0xec] = false;
  param_2[0xed] = false;
  param_2[0xee] = false;
  param_2[0xef] = false;
  param_2[0xf0] = false;
  param_2[0xf1] = false;
  param_2[0xf2] = false;
  param_2[0xf3] = false;
  param_2[0xf4] = false;
  param_2[0xf5] = false;
  param_2[0xf6] = false;
  param_2[0xf7] = false;
  param_2[0xf8] = false;
  param_2[0xf9] = false;
  param_2[0xfa] = false;
  param_2[0xfb] = false;
  param_2[0xfc] = false;
  param_2[0xfd] = false;
  param_2[0xfe] = false;
  param_2[0xff] = false;
  param_2[0x80] = false;
  param_2[0x81] = false;
  param_2[0x82] = false;
  param_2[0x83] = false;
  param_2[0x84] = false;
  param_2[0x85] = false;
  param_2[0x86] = false;
  param_2[0x87] = false;
  param_2[0x88] = false;
  param_2[0x89] = false;
  param_2[0x8a] = false;
  param_2[0x8b] = false;
  param_2[0x8c] = false;
  param_2[0x8d] = false;
  param_2[0x8e] = false;
  param_2[0x8f] = false;
  param_2[0x90] = false;
  param_2[0x91] = false;
  param_2[0x92] = false;
  param_2[0x93] = false;
  param_2[0x94] = false;
  param_2[0x95] = false;
  param_2[0x96] = false;
  param_2[0x97] = false;
  param_2[0x98] = false;
  param_2[0x99] = false;
  param_2[0x9a] = false;
  param_2[0x9b] = false;
  param_2[0x9c] = false;
  param_2[0x9d] = false;
  param_2[0x9e] = false;
  param_2[0x9f] = false;
  param_2[0xa0] = false;
  param_2[0xa1] = false;
  param_2[0xa2] = false;
  param_2[0xa3] = false;
  param_2[0xa4] = false;
  param_2[0xa5] = false;
  param_2[0xa6] = false;
  param_2[0xa7] = false;
  param_2[0xa8] = false;
  param_2[0xa9] = false;
  param_2[0xaa] = false;
  param_2[0xab] = false;
  param_2[0xac] = false;
  param_2[0xad] = false;
  param_2[0xae] = false;
  param_2[0xaf] = false;
  param_2[0xb0] = false;
  param_2[0xb1] = false;
  param_2[0xb2] = false;
  param_2[0xb3] = false;
  param_2[0xb4] = false;
  param_2[0xb5] = false;
  param_2[0xb6] = false;
  param_2[0xb7] = false;
  param_2[0xb8] = false;
  param_2[0xb9] = false;
  param_2[0xba] = false;
  param_2[0xbb] = false;
  param_2[0xbc] = false;
  param_2[0xbd] = false;
  param_2[0xbe] = false;
  param_2[0xbf] = false;
  param_2[0x40] = false;
  param_2[0x41] = false;
  param_2[0x42] = false;
  param_2[0x43] = false;
  param_2[0x44] = false;
  param_2[0x45] = false;
  param_2[0x46] = false;
  param_2[0x47] = false;
  param_2[0x48] = false;
  param_2[0x49] = false;
  param_2[0x4a] = false;
  param_2[0x4b] = false;
  param_2[0x4c] = false;
  param_2[0x4d] = false;
  param_2[0x4e] = false;
  param_2[0x4f] = false;
  param_2[0x50] = false;
  param_2[0x51] = false;
  param_2[0x52] = false;
  param_2[0x53] = false;
  param_2[0x54] = false;
  param_2[0x55] = false;
  param_2[0x56] = false;
  param_2[0x57] = false;
  param_2[0x58] = false;
  param_2[0x59] = false;
  param_2[0x5a] = false;
  param_2[0x5b] = false;
  param_2[0x5c] = false;
  param_2[0x5d] = false;
  param_2[0x5e] = false;
  param_2[0x5f] = false;
  param_2[0x60] = false;
  param_2[0x61] = false;
  param_2[0x62] = false;
  param_2[99] = false;
  param_2[100] = false;
  param_2[0x65] = false;
  param_2[0x66] = false;
  param_2[0x67] = false;
  param_2[0x68] = false;
  param_2[0x69] = false;
  param_2[0x6a] = false;
  param_2[0x6b] = false;
  param_2[0x6c] = false;
  param_2[0x6d] = false;
  param_2[0x6e] = false;
  param_2[0x6f] = false;
  param_2[0x70] = false;
  param_2[0x71] = false;
  param_2[0x72] = false;
  param_2[0x73] = false;
  param_2[0x74] = false;
  param_2[0x75] = false;
  param_2[0x76] = false;
  param_2[0x77] = false;
  param_2[0x78] = false;
  param_2[0x79] = false;
  param_2[0x7a] = false;
  param_2[0x7b] = false;
  param_2[0x7c] = false;
  param_2[0x7d] = false;
  param_2[0x7e] = false;
  param_2[0x7f] = false;
  param_2[0] = false;
  param_2[1] = false;
  param_2[2] = false;
  param_2[3] = false;
  param_2[4] = false;
  param_2[5] = false;
  param_2[6] = false;
  param_2[7] = false;
  param_2[8] = false;
  param_2[9] = false;
  param_2[10] = false;
  param_2[0xb] = false;
  param_2[0xc] = false;
  param_2[0xd] = false;
  param_2[0xe] = false;
  param_2[0xf] = false;
  param_2[0x10] = false;
  param_2[0x11] = false;
  param_2[0x12] = false;
  param_2[0x13] = false;
  param_2[0x14] = false;
  param_2[0x15] = false;
  param_2[0x16] = false;
  param_2[0x17] = false;
  param_2[0x18] = false;
  param_2[0x19] = false;
  param_2[0x1a] = false;
  param_2[0x1b] = false;
  param_2[0x1c] = false;
  param_2[0x1d] = false;
  param_2[0x1e] = false;
  param_2[0x1f] = false;
  param_2[0x20] = false;
  param_2[0x21] = false;
  param_2[0x22] = false;
  param_2[0x23] = false;
  param_2[0x24] = false;
  param_2[0x25] = false;
  param_2[0x26] = false;
  param_2[0x27] = false;
  param_2[0x28] = false;
  param_2[0x29] = false;
  param_2[0x2a] = false;
  param_2[0x2b] = false;
  param_2[0x2c] = false;
  param_2[0x2d] = false;
  param_2[0x2e] = false;
  param_2[0x2f] = false;
  param_2[0x30] = false;
  param_2[0x31] = false;
  param_2[0x32] = false;
  param_2[0x33] = false;
  param_2[0x34] = false;
  param_2[0x35] = false;
  param_2[0x36] = false;
  param_2[0x37] = false;
  param_2[0x38] = false;
  param_2[0x39] = false;
  param_2[0x3a] = false;
  param_2[0x3b] = false;
  param_2[0x3c] = false;
  param_2[0x3d] = false;
  param_2[0x3e] = false;
  param_2[0x3f] = false;
  iVar1 = *iter;
  do {
    bVar4 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar4) {
      return;
    }
    iVar3 = iVar1 + -0x200;
    if (iVar1 < 0x200) {
      iVar3 = iVar1;
    }
    iVar1 = iVar1 + 1;
  } while (global_mask[iVar3] != true);
  param_2[iVar3] = true;
  *iter = iVar3 + 1;
  return;
}

Assistant:

static void ggml_thread_cpumask_next(const bool * global_mask, bool * local_mask, bool strict, int32_t* iter) {
    if (!strict) {
        memcpy(local_mask, global_mask, GGML_MAX_N_THREADS);
        return;
    } else {
        memset(local_mask, 0, GGML_MAX_N_THREADS);
        int32_t base_idx = *iter;
        for (int32_t i = 0; i < GGML_MAX_N_THREADS; i++) {
            int32_t idx = base_idx + i;
            if (idx >= GGML_MAX_N_THREADS) {
                // Just a cheaper modulo
                idx -= GGML_MAX_N_THREADS;
            }
            if (global_mask[idx]) {
                local_mask[idx] = 1;
                *iter = idx + 1;
                return;
            }
        }
    }
}